

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FillPatchUtil_I.H
# Opt level: O1

enable_if_t<IsFabArray<MultiFab>::value>
amrex::FillPatchSingleLevel<amrex::MultiFab,amrex::StateDataPhysBCFunct>
          (MultiFab *mf,IntVect *nghost,Real time,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *smf,
          Vector<double,_std::allocator<double>_> *stime,int scomp,int dcomp,int ncomp,
          Geometry *geom,StateDataPhysBCFunct *physbcf,int bcfcomp)

{
  double dVar1;
  double dVar2;
  pointer ppMVar3;
  FabArray<amrex::FArrayBox> *src;
  MultiFab *pMVar4;
  double *pdVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  double dVar18;
  Periodicity PVar19;
  long local_370;
  long local_360;
  long local_358;
  long local_350;
  Box local_344;
  FabArray<amrex::FArrayBox> *local_328;
  IntVect *local_320;
  undefined4 local_318;
  int local_314;
  long local_310;
  long local_308;
  FabArray<amrex::FArrayBox> *local_300;
  Array4<double> dfab;
  Array4<double> sfab0;
  Array4<double> sfab1;
  MFIter mfi;
  MultiFab raii;
  
  ppMVar3 = (smf->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar8 = (long)(smf->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppMVar3 >> 3;
  local_320 = nghost;
  local_300 = &mf->super_FabArray<amrex::FArrayBox>;
  if (lVar8 != 2) {
    if (lVar8 == 1) {
      src = &(*ppMVar3)->super_FabArray<amrex::FArrayBox>;
      if (scomp == dcomp && src == &mf->super_FabArray<amrex::FArrayBox>) {
        raii.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._0_12_ =
             Geometry::periodicity(geom);
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  (&mf->super_FabArray<amrex::FArrayBox>,dcomp,ncomp,local_320,(Periodicity *)&raii,
                   false);
      }
      else {
        raii.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._0_12_ = ZEXT812(0);
        PVar19 = Geometry::periodicity(geom);
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ =
             (undefined1)PVar19.period.vect[0];
        mfi.m_fa._M_t.
        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
        super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ =
             PVar19.period.vect._1_7_;
        mfi.fabArray._0_4_ = PVar19.period.vect[2];
        FabArray<amrex::FArrayBox>::ParallelCopy_nowait
                  (&mf->super_FabArray<amrex::FArrayBox>,src,scomp,dcomp,ncomp,(IntVect *)&raii,
                   local_320,(Periodicity *)&mfi,COPY,(CPC *)0x0,false);
      }
    }
    else {
      Abort_host("FillPatchSingleLevel: high-order interpolation in time not implemented yet");
    }
    goto LAB_00351b73;
  }
  MultiFab::MultiFab(&raii);
  bVar6 = BoxArray::operator==
                    (&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                     (BoxArray *)
                     ((long)&((*(smf->
                                super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>)
                                .
                                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                             super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8));
  local_328 = local_300;
  if (bVar6) {
    bVar6 = DistributionMapping::operator==
                      (&(((FabArray<amrex::FArrayBox> *)&local_300->super_FabArrayBase)->
                        super_FabArrayBase).distributionMap,
                       (DistributionMapping *)
                       ((long)&((*(smf->
                                  super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                  ).
                                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                               super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0x70));
    local_318 = (undefined4)CONCAT71((int7)((ulong)lVar8 >> 8),1);
    iVar12 = dcomp;
    if (!bVar6) goto LAB_0035109a;
  }
  else {
LAB_0035109a:
    ppMVar3 = (smf->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar4 = *ppMVar3;
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
    mfi.fabArray._0_4_ = 0;
    mfi.fabArray._4_4_ = 0;
    mfi.tile_size.vect[0] = 0;
    mfi.tile_size.vect[1] = 0;
    mfi.tile_size.vect[2] = 0;
    mfi.flags = '\0';
    mfi._29_3_ = 0;
    mfi.currentIndex = 0;
    mfi.beginIndex = 0;
    local_328 = &raii.super_FabArray<amrex::FArrayBox>;
    iVar12 = 0;
    MultiFab::define((MultiFab *)local_328,
                     (BoxArray *)
                     ((long)&(pMVar4->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8),
                     (DistributionMapping *)
                     ((long)&(pMVar4->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0x70),
                     ncomp,0,(MFInfo *)&mfi,
                     (FabFactory<amrex::FArrayBox> *)
                     ((*ppMVar3)->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                     super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                    );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mfi.tile_size);
    local_318 = 0;
  }
  ppMVar3 = (smf->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
            super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_328 == &(*ppMVar3)->super_FabArray<amrex::FArrayBox>) {
    if (scomp != dcomp) goto LAB_003511c7;
  }
  else if ((scomp != dcomp) || (local_328 != &ppMVar3[1]->super_FabArray<amrex::FArrayBox>)) {
LAB_003511c7:
    MFIter::MFIter(&mfi,&local_328->super_FabArrayBase,true);
    if (mfi.currentIndex < mfi.endIndex) {
      local_310 = (long)iVar12 << 3;
      local_308 = (long)scomp << 3;
      do {
        MFIter::tilebox(&local_344,&mfi);
        pdVar5 = (stime->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        dVar1 = *pdVar5;
        dVar2 = pdVar5[1];
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&sfab0,&(*(smf->
                             super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                             super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_FabArray<amrex::FArrayBox>,&mfi);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&sfab1,&(smf->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                           ).
                           super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[1]->
                           super_FabArray<amrex::FArrayBox>,&mfi);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&dfab,local_328,&mfi);
        if ((dVar1 != time) || (NAN(dVar1) || NAN(time))) {
          if ((dVar2 != time) || (NAN(dVar2) || NAN(time))) {
            dVar18 = ABS(dVar1 + dVar2) * 2.220446049250313e-16;
            if ((ABS(dVar1 - dVar2) < 2.2250738585072014e-308) ||
               (ABS(dVar1 - dVar2) <= dVar18 + dVar18)) {
              if (0 < ncomp) {
                lVar8 = (long)local_344.smallend.vect[1];
                local_370 = local_308;
                local_360 = local_310;
                uVar11 = 0;
                do {
                  iVar12 = local_344.smallend.vect[2];
                  if (local_344.smallend.vect[2] <= local_344.bigend.vect[2]) {
                    do {
                      if (local_344.smallend.vect[1] <= local_344.bigend.vect[1]) {
                        lVar9 = (long)dfab.p +
                                dfab.nstride * local_360 +
                                (lVar8 - dfab.begin.y) * dfab.jstride * 8 +
                                ((long)iVar12 - (long)dfab.begin.z) * dfab.kstride * 8 +
                                (long)dfab.begin.x * -8 + (long)local_344.smallend.vect[0] * 8;
                        lVar7 = CONCAT44(sfab0.jstride._4_4_,(int)sfab0.jstride) * 8;
                        lVar13 = (long)sfab0.p +
                                 sfab0.nstride * local_370 +
                                 (lVar8 - sfab0.begin.y) * lVar7 +
                                 ((long)iVar12 - (long)sfab0.begin.z) * sfab0.kstride * 8 +
                                 (long)sfab0.begin.x * -8 + (long)local_344.smallend.vect[0] * 8;
                        lVar10 = lVar8;
                        do {
                          if (local_344.smallend.vect[0] <= local_344.bigend.vect[0]) {
                            lVar16 = 0;
                            do {
                              *(undefined8 *)(lVar9 + lVar16 * 8) =
                                   *(undefined8 *)(lVar13 + lVar16 * 8);
                              lVar16 = lVar16 + 1;
                            } while ((local_344.bigend.vect[0] - local_344.smallend.vect[0]) + 1 !=
                                     (int)lVar16);
                          }
                          lVar10 = lVar10 + 1;
                          lVar9 = lVar9 + dfab.jstride * 8;
                          lVar13 = lVar13 + lVar7;
                        } while (local_344.bigend.vect[1] + 1 != (int)lVar10);
                      }
                      bVar6 = iVar12 != local_344.bigend.vect[2];
                      iVar12 = iVar12 + 1;
                    } while (bVar6);
                  }
                  uVar11 = uVar11 + 1;
                  local_360 = local_360 + 8;
                  local_370 = local_370 + 8;
                } while (uVar11 != (uint)ncomp);
              }
            }
            else if (0 < ncomp) {
              local_314 = local_344.smallend.vect[2];
              lVar8 = (long)local_344.smallend.vect[1];
              lVar10 = (long)local_344.smallend.vect[0] * 8;
              local_350 = local_308;
              local_358 = local_310;
              uVar11 = 0;
              do {
                iVar12 = local_344.smallend.vect[2];
                if (local_344.smallend.vect[2] <= local_344.bigend.vect[2]) {
                  do {
                    if (local_344.smallend.vect[1] <= local_344.bigend.vect[1]) {
                      lVar7 = (long)iVar12;
                      lVar9 = (long)dfab.p +
                              dfab.nstride * local_358 +
                              (lVar8 - dfab.begin.y) * dfab.jstride * 8 +
                              (lVar7 - dfab.begin.z) * dfab.kstride * 8 + (long)dfab.begin.x * -8 +
                              lVar10;
                      lVar13 = CONCAT44(sfab1.jstride._4_4_,(int)sfab1.jstride) * 8;
                      lVar17 = (long)sfab1.p +
                               sfab1.nstride * local_350 +
                               (lVar8 - sfab1.begin.y) * lVar13 +
                               (lVar7 - sfab1.begin.z) * sfab1.kstride * 8 +
                               (long)sfab1.begin.x * -8 + lVar10;
                      lVar16 = CONCAT44(sfab0.jstride._4_4_,(int)sfab0.jstride) * 8;
                      lVar14 = (long)sfab0.p +
                               sfab0.nstride * local_350 +
                               (lVar8 - sfab0.begin.y) * lVar16 +
                               (lVar7 - sfab0.begin.z) * sfab0.kstride * 8 +
                               (long)sfab0.begin.x * -8 + lVar10;
                      lVar7 = lVar8;
                      do {
                        if (local_344.smallend.vect[0] <= local_344.bigend.vect[0]) {
                          lVar15 = 0;
                          do {
                            *(double *)(lVar9 + lVar15 * 8) =
                                 *(double *)(lVar14 + lVar15 * 8) *
                                 ((dVar2 - time) / (dVar2 - dVar1)) +
                                 *(double *)(lVar17 + lVar15 * 8) *
                                 ((time - dVar1) / (dVar2 - dVar1));
                            lVar15 = lVar15 + 1;
                          } while ((local_344.bigend.vect[0] - local_344.smallend.vect[0]) + 1 !=
                                   (int)lVar15);
                        }
                        lVar7 = lVar7 + 1;
                        lVar9 = lVar9 + dfab.jstride * 8;
                        lVar17 = lVar17 + lVar13;
                        lVar14 = lVar14 + lVar16;
                      } while (local_344.bigend.vect[1] + 1 != (int)lVar7);
                    }
                    bVar6 = iVar12 != local_344.bigend.vect[2];
                    iVar12 = iVar12 + 1;
                  } while (bVar6);
                }
                uVar11 = uVar11 + 1;
                local_358 = local_358 + 8;
                local_350 = local_350 + 8;
              } while (uVar11 != (uint)ncomp);
            }
          }
          else if (0 < ncomp) {
            lVar8 = (long)local_344.smallend.vect[1];
            local_370 = local_308;
            local_360 = local_310;
            uVar11 = 0;
            do {
              iVar12 = local_344.smallend.vect[2];
              if (local_344.smallend.vect[2] <= local_344.bigend.vect[2]) {
                do {
                  if (local_344.smallend.vect[1] <= local_344.bigend.vect[1]) {
                    lVar9 = (long)dfab.p +
                            dfab.nstride * local_360 +
                            (lVar8 - dfab.begin.y) * dfab.jstride * 8 +
                            ((long)iVar12 - (long)dfab.begin.z) * dfab.kstride * 8 +
                            (long)dfab.begin.x * -8 + (long)local_344.smallend.vect[0] * 8;
                    lVar7 = CONCAT44(sfab1.jstride._4_4_,(int)sfab1.jstride) * 8;
                    lVar13 = (long)sfab1.p +
                             sfab1.nstride * local_370 +
                             (lVar8 - sfab1.begin.y) * lVar7 +
                             ((long)iVar12 - (long)sfab1.begin.z) * sfab1.kstride * 8 +
                             (long)sfab1.begin.x * -8 + (long)local_344.smallend.vect[0] * 8;
                    lVar10 = lVar8;
                    do {
                      if (local_344.smallend.vect[0] <= local_344.bigend.vect[0]) {
                        lVar16 = 0;
                        do {
                          *(undefined8 *)(lVar9 + lVar16 * 8) = *(undefined8 *)(lVar13 + lVar16 * 8)
                          ;
                          lVar16 = lVar16 + 1;
                        } while ((local_344.bigend.vect[0] - local_344.smallend.vect[0]) + 1 !=
                                 (int)lVar16);
                      }
                      lVar10 = lVar10 + 1;
                      lVar9 = lVar9 + dfab.jstride * 8;
                      lVar13 = lVar13 + lVar7;
                    } while (local_344.bigend.vect[1] + 1 != (int)lVar10);
                  }
                  bVar6 = iVar12 != local_344.bigend.vect[2];
                  iVar12 = iVar12 + 1;
                } while (bVar6);
              }
              uVar11 = uVar11 + 1;
              local_360 = local_360 + 8;
              local_370 = local_370 + 8;
            } while (uVar11 != (uint)ncomp);
          }
        }
        else if (0 < ncomp) {
          lVar8 = (long)local_344.smallend.vect[1];
          local_370 = local_308;
          local_360 = local_310;
          uVar11 = 0;
          do {
            iVar12 = local_344.smallend.vect[2];
            if (local_344.smallend.vect[2] <= local_344.bigend.vect[2]) {
              do {
                if (local_344.smallend.vect[1] <= local_344.bigend.vect[1]) {
                  lVar9 = (long)dfab.p +
                          dfab.nstride * local_360 +
                          (lVar8 - dfab.begin.y) * dfab.jstride * 8 +
                          ((long)iVar12 - (long)dfab.begin.z) * dfab.kstride * 8 +
                          (long)dfab.begin.x * -8 + (long)local_344.smallend.vect[0] * 8;
                  lVar7 = CONCAT44(sfab0.jstride._4_4_,(int)sfab0.jstride) * 8;
                  lVar13 = (long)sfab0.p +
                           sfab0.nstride * local_370 +
                           (lVar8 - sfab0.begin.y) * lVar7 +
                           ((long)iVar12 - (long)sfab0.begin.z) * sfab0.kstride * 8 +
                           (long)sfab0.begin.x * -8 + (long)local_344.smallend.vect[0] * 8;
                  lVar10 = lVar8;
                  do {
                    if (local_344.smallend.vect[0] <= local_344.bigend.vect[0]) {
                      lVar16 = 0;
                      do {
                        *(undefined8 *)(lVar9 + lVar16 * 8) = *(undefined8 *)(lVar13 + lVar16 * 8);
                        lVar16 = lVar16 + 1;
                      } while ((local_344.bigend.vect[0] - local_344.smallend.vect[0]) + 1 !=
                               (int)lVar16);
                    }
                    lVar10 = lVar10 + 1;
                    lVar9 = lVar9 + dfab.jstride * 8;
                    lVar13 = lVar13 + lVar7;
                  } while (local_344.bigend.vect[1] + 1 != (int)lVar10);
                }
                bVar6 = iVar12 != local_344.bigend.vect[2];
                iVar12 = iVar12 + 1;
              } while (bVar6);
            }
            uVar11 = uVar11 + 1;
            local_360 = local_360 + 8;
            local_370 = local_370 + 8;
          } while (uVar11 != (uint)ncomp);
        }
        MFIter::operator++(&mfi);
      } while (mfi.currentIndex < mfi.endIndex);
    }
    MFIter::~MFIter(&mfi);
  }
  if ((char)local_318 == '\0') {
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 0;
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
    mfi.fabArray._0_4_ = 0;
    sfab0.jstride._0_4_ = local_320->vect[2];
    sfab0.p = *(double **)local_320->vect;
    PVar19 = Geometry::periodicity(geom);
    sfab1.p = PVar19.period.vect._0_8_;
    sfab1.jstride._0_4_ = PVar19.period.vect[2];
    FabArray<amrex::FArrayBox>::ParallelCopy_nowait
              (local_300,local_328,0,dcomp,ncomp,(IntVect *)&mfi,(IntVect *)&sfab0,
               (Periodicity *)&sfab1,COPY,(CPC *)0x0,false);
  }
  else {
    PVar19 = Geometry::periodicity(geom);
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ =
         (undefined1)PVar19.period.vect[0];
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ =
         PVar19.period.vect._1_7_;
    mfi.fabArray._0_4_ = PVar19.period.vect[2];
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (local_300,dcomp,ncomp,local_320,(Periodicity *)&mfi,false);
  }
  MultiFab::~MultiFab(&raii);
LAB_00351b73:
  StateDataPhysBCFunct::operator()(physbcf,(MultiFab *)local_300,dcomp,ncomp,local_320,time,bcfcomp)
  ;
  return;
}

Assistant:

std::enable_if_t<IsFabArray<MF>::value>
FillPatchSingleLevel (MF& mf, IntVect const& nghost, Real time,
                      const Vector<MF*>& smf, const Vector<Real>& stime,
                      int scomp, int dcomp, int ncomp,
                      const Geometry& geom,
                      BC& physbcf, int bcfcomp)
{
    BL_PROFILE("FillPatchSingleLevel");

    AMREX_ASSERT(scomp+ncomp <= smf[0]->nComp());
    AMREX_ASSERT(dcomp+ncomp <= mf.nComp());
    AMREX_ASSERT(smf.size() == stime.size());
    AMREX_ASSERT(smf.size() != 0);
    AMREX_ASSERT(nghost.allLE(mf.nGrowVect()));

    if (smf.size() == 1)
    {
        if (&mf == smf[0] && scomp == dcomp) {
            mf.FillBoundary(dcomp, ncomp, nghost, geom.periodicity());
        } else {
            mf.ParallelCopy(*smf[0], scomp, dcomp, ncomp, IntVect{0}, nghost, geom.periodicity());
        }
    }
    else if (smf.size() == 2)
    {
        BL_ASSERT(smf[0]->boxArray() == smf[1]->boxArray());
        MF raii;
        MF * dmf;
        int destcomp;
        bool sameba;
        if (mf.boxArray() == smf[0]->boxArray() &&
            mf.DistributionMap() == smf[0]->DistributionMap())
        {
            dmf = &mf;
            destcomp = dcomp;
            sameba = true;
        } else {
            raii.define(smf[0]->boxArray(), smf[0]->DistributionMap(), ncomp, 0,
                        MFInfo(), smf[0]->Factory());

            dmf = &raii;
            destcomp = 0;
            sameba = false;
        }

        if ((dmf != smf[0] && dmf != smf[1]) || scomp != dcomp)
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*dmf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.tilebox();
                const Real t0 = stime[0];
                const Real t1 = stime[1];
                auto const sfab0 = smf[0]->array(mfi);
                auto const sfab1 = smf[1]->array(mfi);
                auto       dfab  = dmf->array(mfi);

                if (time == t0)
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                    {
                        dfab(i,j,k,n+destcomp) = sfab0(i,j,k,n+scomp);
                    });
                }
                else if (time == t1)
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                    {
                        dfab(i,j,k,n+destcomp) = sfab1(i,j,k,n+scomp);
                    });
                }
                else if (! amrex::almostEqual(t0,t1))
                {
                    Real alpha = (t1-time)/(t1-t0);
                    Real beta = (time-t0)/(t1-t0);
                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                    {
                        dfab(i,j,k,n+destcomp) = alpha*sfab0(i,j,k,n+scomp)
                            +                     beta*sfab1(i,j,k,n+scomp);
                    });
                }
                else
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                    {
                        dfab(i,j,k,n+destcomp) = sfab0(i,j,k,n+scomp);
                    });
                }
            }
        }

        if (sameba)
        {
            // Note that when sameba is true mf's BoxArray is nonoverlapping.
            // So FillBoundary is safe.
            mf.FillBoundary(dcomp, ncomp, nghost, geom.periodicity());
        }
        else
        {
            IntVect src_ngrow = IntVect::TheZeroVector();
            IntVect dst_ngrow = nghost;

            mf.ParallelCopy(*dmf, 0, dcomp, ncomp, src_ngrow, dst_ngrow, geom.periodicity());
        }
    }
    else {
        amrex::Abort("FillPatchSingleLevel: high-order interpolation in time not implemented yet");
    }

    physbcf(mf, dcomp, ncomp, nghost, time, bcfcomp);
}